

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O0

int WebPPictureAllocYUVA(WebPPicture *picture)

{
  WebPEncCSP WVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint8_t *puVar8;
  WebPPicture *in_RDI;
  uint8_t *mem;
  uint64_t total_size;
  uint64_t a_size;
  uint64_t uv_size;
  uint64_t y_size;
  int a_stride;
  int a_width;
  int uv_stride;
  int uv_height;
  int uv_width;
  int y_stride;
  int height;
  int width;
  int has_alpha;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  size_t in_stack_ffffffffffffffa0;
  int local_4;
  
  WVar1 = in_RDI->colorspace;
  iVar2 = in_RDI->width;
  iVar3 = in_RDI->height;
  iVar4 = (int)((long)iVar2 + 1 >> 1);
  iVar5 = (int)((long)iVar3 + 1 >> 1);
  iVar6 = WebPValidatePicture((WebPPicture *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (iVar6 == 0) {
    local_4 = 0;
  }
  else {
    WebPSafeFree((void *)0x157e1d);
    WebPPictureResetBufferYUVA(in_RDI);
    iVar6 = iVar2;
    if ((WVar1 & WEBP_CSP_ALPHA_BIT) == WEBP_YUV420) {
      iVar6 = 0;
    }
    lVar7 = (long)iVar4 * (long)iVar5;
    if ((((iVar2 < 1) || (iVar3 < 1)) || (iVar4 < 1)) || (iVar5 < 1)) {
      local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_BAD_DIMENSION);
    }
    else {
      puVar8 = (uint8_t *)
               WebPSafeMalloc((long)iVar2 * (long)iVar3 + (long)iVar6 * (long)iVar3 + lVar7 * 2,
                              in_stack_ffffffffffffffa0);
      if (puVar8 == (uint8_t *)0x0) {
        local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_OUT_OF_MEMORY);
      }
      else {
        in_RDI->memory_ = puVar8;
        in_RDI->y_stride = iVar2;
        in_RDI->uv_stride = iVar4;
        in_RDI->a_stride = iVar6;
        in_RDI->y = puVar8;
        puVar8 = puVar8 + (long)iVar2 * (long)iVar3;
        in_RDI->u = puVar8;
        in_RDI->v = puVar8 + lVar7;
        if ((long)iVar6 * (long)iVar3 != 0) {
          in_RDI->a = puVar8 + lVar7 + lVar7;
        }
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int WebPPictureAllocYUVA(WebPPicture* const picture) {
  const int has_alpha = (int)picture->colorspace & WEBP_CSP_ALPHA_BIT;
  const int width = picture->width;
  const int height = picture->height;
  const int y_stride = width;
  const int uv_width = (int)(((int64_t)width + 1) >> 1);
  const int uv_height = (int)(((int64_t)height + 1) >> 1);
  const int uv_stride = uv_width;
  int a_width, a_stride;
  uint64_t y_size, uv_size, a_size, total_size;
  uint8_t* mem;

  if (!WebPValidatePicture(picture)) return 0;

  WebPSafeFree(picture->memory_);
  WebPPictureResetBufferYUVA(picture);

  // alpha
  a_width = has_alpha ? width : 0;
  a_stride = a_width;
  y_size = (uint64_t)y_stride * height;
  uv_size = (uint64_t)uv_stride * uv_height;
  a_size =  (uint64_t)a_stride * height;

  total_size = y_size + a_size + 2 * uv_size;

  // Security and validation checks
  if (width <= 0 || height <= 0 ||           // luma/alpha param error
      uv_width <= 0 || uv_height <= 0) {     // u/v param error
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
  }
  // allocate a new buffer.
  mem = (uint8_t*)WebPSafeMalloc(total_size, sizeof(*mem));
  if (mem == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }

  // From now on, we're in the clear, we can no longer fail...
  picture->memory_ = (void*)mem;
  picture->y_stride  = y_stride;
  picture->uv_stride = uv_stride;
  picture->a_stride  = a_stride;

  // TODO(skal): we could align the y/u/v planes and adjust stride.
  picture->y = mem;
  mem += y_size;

  picture->u = mem;
  mem += uv_size;
  picture->v = mem;
  mem += uv_size;

  if (a_size > 0) {
    picture->a = mem;
    mem += a_size;
  }
  (void)mem;  // makes the static analyzer happy
  return 1;
}